

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  GCObject *pGVar1;
  global_State *p_00;
  int iVar2;
  long lVar3;
  StkId pTVar4;
  CallInfo *pCVar5;
  int in_EDX;
  StkId in_RSI;
  lua_State *in_RDI;
  int n;
  CallInfo *ci_1;
  int nargs;
  Proto *p;
  StkId base;
  StkId st;
  CallInfo *ci;
  ptrdiff_t funcr;
  LClosure *cl;
  undefined8 in_stack_ffffffffffffff88;
  lua_State *in_stack_ffffffffffffff90;
  StkId in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  StkId local_18;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_18 = in_RSI;
  if (in_RSI->tt != 6) {
    local_18 = tryfuncTM(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  lVar3 = (long)local_18 - (long)in_RDI->stack;
  pGVar1 = (local_18->value).gc;
  in_RDI->ci->savedpc = in_RDI->savedpc;
  if ((pGVar1->h).flags == '\0') {
    p_00 = (pGVar1->th).l_G;
    if ((long)in_RDI->stack_last - (long)in_RDI->top <=
        (long)(int)((uint)*(lu_byte *)((long)&p_00->GCthreshold + 3) << 4)) {
      luaD_growstack(in_stack_ffffffffffffff90,iVar2);
    }
    local_18 = (StkId)((long)in_RDI->stack + lVar3);
    if (*(lu_byte *)((long)&p_00->GCthreshold + 2) == '\0') {
      pTVar4 = local_18 + 1;
      if (pTVar4 + (int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 1) < in_RDI->top) {
        in_RDI->top = pTVar4 + (int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 1);
      }
    }
    else {
      pTVar4 = adjust_varargs(in_RDI,(Proto *)p_00,
                              (int)((long)in_RDI->top - (long)local_18 >> 4) + -1);
      local_18 = (StkId)((long)in_RDI->stack + lVar3);
    }
    if (in_RDI->ci == in_RDI->end_ci) {
      pCVar5 = growCI((lua_State *)0x106f60);
    }
    else {
      pCVar5 = in_RDI->ci + 1;
      in_RDI->ci = pCVar5;
    }
    pCVar5->func = local_18;
    pCVar5->base = pTVar4;
    in_RDI->base = pTVar4;
    pCVar5->top = in_RDI->base + (int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 3);
    in_RDI->savedpc = (Instruction *)p_00->ud;
    pCVar5->tailcalls = 0;
    pCVar5->nresults = in_EDX;
    for (pTVar4 = in_RDI->top; pTVar4 < pCVar5->top; pTVar4 = pTVar4 + 1) {
      pTVar4->tt = 0;
    }
    in_RDI->top = pCVar5->top;
    local_4 = 0;
  }
  else {
    if ((long)in_RDI->stack_last - (long)in_RDI->top < 0x141) {
      luaD_growstack(in_stack_ffffffffffffff90,iVar2);
    }
    if (in_RDI->ci == in_RDI->end_ci) {
      pCVar5 = growCI((lua_State *)0x1070a0);
    }
    else {
      pCVar5 = in_RDI->ci + 1;
      in_RDI->ci = pCVar5;
    }
    pCVar5->func = (StkId)((long)in_RDI->stack + lVar3);
    pCVar5->base = pCVar5->func + 1;
    in_RDI->base = pCVar5->func + 1;
    pCVar5->top = in_RDI->top + 0x14;
    pCVar5->nresults = in_EDX;
    iVar2 = (*(code *)(((in_RDI->ci->func->value).gc)->h).node)(in_RDI);
    if (iVar2 < 0) {
      local_4 = 2;
    }
    else {
      luaD_poscall(in_RDI,in_RDI->top + -(long)iVar2);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}